

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_LoadFactor_Test<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_LoadFactor_Test<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  size_type sVar2;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  int i_1;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  float shrink_threshold;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  int i;
  size_t bucket_count;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  TypeParam ht;
  float grow_threshold;
  size_type kSize;
  key_type *in_stack_fffffffffffffa88;
  BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffa90;
  HashtableTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffa98;
  hasher *in_stack_fffffffffffffaa0;
  undefined4 in_stack_fffffffffffffaa8;
  float in_stack_fffffffffffffaac;
  float in_stack_fffffffffffffab0;
  float in_stack_fffffffffffffab4;
  float in_stack_fffffffffffffabc;
  float type;
  AssertHelper *in_stack_fffffffffffffac0;
  char *in_stack_fffffffffffffad0;
  undefined4 in_stack_fffffffffffffad8;
  float in_stack_fffffffffffffadc;
  float local_510;
  float local_4fc;
  Message *in_stack_fffffffffffffb08;
  AssertHelper *in_stack_fffffffffffffb10;
  float local_4c4;
  float local_4bc;
  AssertionResult local_448;
  value_type *in_stack_fffffffffffffbc8;
  BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffbd0;
  AssertionResult local_420 [6];
  string local_3b8 [32];
  string local_398 [32];
  string local_378 [36];
  int local_354;
  float local_33c;
  AssertionResult local_338 [2];
  float local_314;
  undefined8 local_310;
  AssertionResult local_308;
  float local_2f4;
  size_type local_2e0;
  AssertionResult local_2d8 [2];
  size_type local_2b8;
  AssertionResult local_2b0 [6];
  string local_248 [36];
  int local_224;
  string local_220 [120];
  string local_1a8 [32];
  size_type local_188;
  float local_16c;
  undefined8 local_168;
  AssertionResult local_160 [2];
  float local_13c;
  AssertionResult local_138;
  string local_128 [48];
  Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
  local_f8;
  Hasher local_e8;
  Hasher local_dc [16];
  float local_14;
  undefined8 local_10;
  
  local_10 = 0x4098;
  for (local_14 = 0.2; local_14 <= 0.8; local_14 = local_14 + 0.2) {
    Hasher::Hasher(local_dc,0);
    Hasher::Hasher(&local_e8,0);
    Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
    ::Alloc(&local_f8,0,(int *)0x0);
    google::
    HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
    ::HashtableInterface_SparseHashSet
              ((HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
                *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0),
               CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8),
               in_stack_fffffffffffffaa0,(key_equal *)in_stack_fffffffffffffa98,
               (allocator_type *)in_stack_fffffffffffffa90);
    Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
    ::~Alloc(&local_f8);
    HashtableTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                 *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
                (int)((ulong)in_stack_fffffffffffffad0 >> 0x20));
    google::
    BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::set_deleted_key(in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
    std::__cxx11::string::~string(local_128);
    google::
    BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::max_load_factor(in_stack_fffffffffffffa90,(float)((ulong)in_stack_fffffffffffffa88 >> 0x20));
    google::
    BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::min_load_factor(in_stack_fffffffffffffa90,(float)((ulong)in_stack_fffffffffffffa88 >> 0x20));
    local_13c = google::
                BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                ::max_load_factor((BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                                   *)0xcb83f5);
    testing::internal::EqHelper::Compare<float,_float,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8),
               (char *)in_stack_fffffffffffffaa0,(float *)in_stack_fffffffffffffa98,
               (float *)in_stack_fffffffffffffa90);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_138);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffac0);
      testing::AssertionResult::failure_message((AssertionResult *)0xcb84d8);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffac0,(Type)in_stack_fffffffffffffabc,
                 (char *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0),
                 (int)in_stack_fffffffffffffaac,(char *)in_stack_fffffffffffffaa0);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffa90);
      testing::Message::~Message((Message *)0xcb853b);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xcb85ac);
    local_168 = 0;
    local_16c = google::
                BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                ::min_load_factor((BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                                   *)0xcb85c5);
    testing::internal::EqHelper::Compare<double,_float,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8),
               (char *)in_stack_fffffffffffffaa0,(double *)in_stack_fffffffffffffa98,
               (float *)in_stack_fffffffffffffa90);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_160);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffac0);
      testing::AssertionResult::failure_message((AssertionResult *)0xcb8655);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffac0,(Type)in_stack_fffffffffffffabc,
                 (char *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0),
                 (int)in_stack_fffffffffffffaac,(char *)in_stack_fffffffffffffaa0);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffa90);
      testing::Message::~Message((Message *)0xcb86b8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xcb8729);
    google::
    BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::resize(in_stack_fffffffffffffa90,(size_type)in_stack_fffffffffffffa88);
    local_188 = google::
                BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                ::bucket_count((BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                                *)0xcb874a);
    HashtableTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueObject(in_stack_fffffffffffffa98,(int)((ulong)in_stack_fffffffffffffa90 >> 0x20));
    google::
    BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
    std::__cxx11::string::~string(local_1a8);
    HashtableTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                 *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
                (int)((ulong)in_stack_fffffffffffffad0 >> 0x20));
    google::
    BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase(in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
    std::__cxx11::string::~string(local_220);
    local_224 = 2;
    while( true ) {
      HashtableTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
      ::UniqueObject(in_stack_fffffffffffffa98,(int)((ulong)in_stack_fffffffffffffa90 >> 0x20));
      google::
      BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
      ::insert(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
      std::__cxx11::string::~string(local_248);
      sVar2 = google::
              BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xcb884e);
      local_4bc = (float)sVar2;
      local_4c4 = (float)local_188;
      if (local_14 <= local_4bc / local_4c4) break;
      local_2b8 = google::
                  BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                  ::bucket_count((BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                                  *)0xcb8939);
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                ((char *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8),
                 (char *)in_stack_fffffffffffffaa0,(unsigned_long *)in_stack_fffffffffffffa98,
                 (unsigned_long *)in_stack_fffffffffffffa90);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2b0);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffac0);
        testing::AssertionResult::failure_message((AssertionResult *)0xcb8a3b);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffac0,(Type)in_stack_fffffffffffffabc,
                   (char *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0),
                   (int)in_stack_fffffffffffffaac,(char *)in_stack_fffffffffffffaa0);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffa90);
        testing::Message::~Message((Message *)0xcb8a9e);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xcb8b09);
      local_224 = local_224 + 1;
    }
    local_2e0 = google::
                BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                ::bucket_count((BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                                *)0xcb8b2d);
    testing::internal::CmpHelperGT<unsigned_long,unsigned_long>
              ((char *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8),
               (char *)in_stack_fffffffffffffaa0,(unsigned_long *)in_stack_fffffffffffffa98,
               (unsigned_long *)in_stack_fffffffffffffa90);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2d8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffac0);
      in_stack_fffffffffffffb10 =
           (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0xcb8ba8);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffac0,(Type)in_stack_fffffffffffffabc,
                 (char *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0),
                 (int)in_stack_fffffffffffffaac,(char *)in_stack_fffffffffffffaa0);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffa90);
      testing::Message::~Message((Message *)0xcb8c0b);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xcb8c76);
    in_stack_fffffffffffffb08 =
         (Message *)
         google::
         BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
         ::size((BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                 *)0xcb8caf);
    local_4fc = (float)in_stack_fffffffffffffb08;
    sVar2 = google::
            BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
            ::bucket_count((BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                            *)0xcb8d13);
    local_510 = (float)sVar2;
    local_2f4 = local_4fc / local_510 + -0.01;
    google::
    BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::set_resizing_parameters
              (in_stack_fffffffffffffa90,(float)((ulong)in_stack_fffffffffffffa88 >> 0x20),
               SUB84(in_stack_fffffffffffffa88,0));
    local_310 = 0x3ff0000000000000;
    local_314 = google::
                BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                ::max_load_factor((BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                                   *)0xcb8dbc);
    testing::internal::EqHelper::Compare<double,_float,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8),
               (char *)in_stack_fffffffffffffaa0,(double *)in_stack_fffffffffffffa98,
               (float *)in_stack_fffffffffffffa90);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_308);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffac0);
      testing::AssertionResult::failure_message((AssertionResult *)0xcb8e34);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffac0,(Type)in_stack_fffffffffffffabc,
                 (char *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0),
                 (int)in_stack_fffffffffffffaac,(char *)in_stack_fffffffffffffaa0);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffa90);
      testing::Message::~Message((Message *)0xcb8e91);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xcb8eff);
    in_stack_fffffffffffffadc =
         google::
         BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
         ::min_load_factor((BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                            *)0xcb8f0c);
    local_33c = in_stack_fffffffffffffadc;
    testing::internal::EqHelper::Compare<float,_float,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8),
               (char *)in_stack_fffffffffffffaa0,(float *)in_stack_fffffffffffffa98,
               (float *)in_stack_fffffffffffffa90);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_338);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffac0);
      in_stack_fffffffffffffad0 =
           testing::AssertionResult::failure_message((AssertionResult *)0xcb8f96);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffac0,(Type)in_stack_fffffffffffffabc,
                 (char *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0),
                 (int)in_stack_fffffffffffffaac,(char *)in_stack_fffffffffffffaa0);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffa90);
      testing::Message::~Message((Message *)0xcb8ff3);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xcb9064);
    local_188 = google::
                BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                ::bucket_count((BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                                *)0xcb9071);
    local_354 = 2;
    while( true ) {
      HashtableTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
      ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                   *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
                  (int)((ulong)in_stack_fffffffffffffad0 >> 0x20));
      google::
      BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
      ::erase(in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
      std::__cxx11::string::~string(local_378);
      HashtableTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
      ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                   *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
                  (int)((ulong)in_stack_fffffffffffffad0 >> 0x20));
      google::
      BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
      ::erase(in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
      std::__cxx11::string::~string(local_398);
      HashtableTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
      ::UniqueObject(in_stack_fffffffffffffa98,(int)((ulong)in_stack_fffffffffffffa90 >> 0x20));
      google::
      BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
      ::insert(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
      std::__cxx11::string::~string(local_3b8);
      in_stack_fffffffffffffac0 =
           (AssertHelper *)
           google::
           BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
           ::size((BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                   *)0xcb916f);
      in_stack_fffffffffffffaac = (float)in_stack_fffffffffffffac0;
      in_stack_fffffffffffffab0 = (float)(long)local_188;
      in_stack_fffffffffffffab4 = (float)local_188;
      if (in_stack_fffffffffffffaac / in_stack_fffffffffffffab4 <= local_2f4) break;
      type = in_stack_fffffffffffffaac;
      in_stack_fffffffffffffaa0 =
           (hasher *)
           google::
           BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
           ::bucket_count((BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                           *)0xcb922c);
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                ((char *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8),
                 (char *)in_stack_fffffffffffffaa0,(unsigned_long *)in_stack_fffffffffffffa98,
                 (unsigned_long *)in_stack_fffffffffffffa90);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_420);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffac0);
        in_stack_fffffffffffffa98 =
             (HashtableTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
              *)testing::AssertionResult::failure_message((AssertionResult *)0xcb9328);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffac0,(Type)type,
                   (char *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0),
                   (int)in_stack_fffffffffffffaac,(char *)in_stack_fffffffffffffaa0);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffa90);
        testing::Message::~Message((Message *)0xcb9385);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xcb93f0);
      local_354 = local_354 + 1;
    }
    in_stack_fffffffffffffabc = in_stack_fffffffffffffaac;
    in_stack_fffffffffffffa90 =
         (BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
          *)google::
            BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
            ::bucket_count((BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                            *)0xcb9414);
    testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
              ((char *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8),
               (char *)in_stack_fffffffffffffaa0,(unsigned_long *)in_stack_fffffffffffffa98,
               (unsigned_long *)in_stack_fffffffffffffa90);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_448);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffac0);
      in_stack_fffffffffffffa88 =
           (key_type *)testing::AssertionResult::failure_message((AssertionResult *)0xcb9489);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffac0,(Type)in_stack_fffffffffffffabc,
                 (char *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0),
                 (int)in_stack_fffffffffffffaac,(char *)in_stack_fffffffffffffaa0);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffa90);
      testing::Message::~Message((Message *)0xcb94e4);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xcb954f);
    google::
    HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
    ::~HashtableInterface_SparseHashSet
              ((HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
                *)0xcb9585);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, LoadFactor) {
  const typename TypeParam::size_type kSize = 16536;
  // Check growing past various thresholds and then shrinking below
  // them.
  for (float grow_threshold = 0.2f; grow_threshold <= 0.8f;
       grow_threshold += 0.2f) {
    TypeParam ht;
    ht.set_deleted_key(this->UniqueKey(1));
    ht.max_load_factor(grow_threshold);
    ht.min_load_factor(0.0);
    EXPECT_EQ(grow_threshold, ht.max_load_factor());
    EXPECT_EQ(0.0, ht.min_load_factor());

    ht.resize(kSize);
    size_t bucket_count = ht.bucket_count();
    // Erase and insert an element to set consider_shrink = true,
    // which should not cause a shrink because the threshold is 0.0.
    ht.insert(this->UniqueObject(2));
    ht.erase(this->UniqueKey(2));
    for (int i = 2;; ++i) {
      ht.insert(this->UniqueObject(i));
      if (static_cast<float>(ht.size()) / bucket_count < grow_threshold) {
        EXPECT_EQ(bucket_count, ht.bucket_count());
      } else {
        EXPECT_GT(ht.bucket_count(), bucket_count);
        break;
      }
    }
    // Now set a shrink threshold 1% below the current size and remove
    // items until the size falls below that.
    const float shrink_threshold =
        static_cast<float>(ht.size()) / ht.bucket_count() - 0.01f;

    // This time around, check the old set_resizing_parameters interface.
    ht.set_resizing_parameters(shrink_threshold, 1.0);
    EXPECT_EQ(1.0, ht.max_load_factor());
    EXPECT_EQ(shrink_threshold, ht.min_load_factor());

    bucket_count = ht.bucket_count();
    for (int i = 2;; ++i) {
      ht.erase(this->UniqueKey(i));
      // A resize is only triggered by an insert, so add and remove a
      // value every iteration to trigger the shrink as soon as the
      // threshold is passed.
      ht.erase(this->UniqueKey(i + 1));
      ht.insert(this->UniqueObject(i + 1));
      if (static_cast<float>(ht.size()) / bucket_count > shrink_threshold) {
        EXPECT_EQ(bucket_count, ht.bucket_count());
      } else {
        EXPECT_LT(ht.bucket_count(), bucket_count);
        break;
      }
    }
  }
}